

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void js_alloc_string_cold_1(void)

{
  long lVar1;
  JSContext *in_RSI;
  long *in_RDI;
  
  lVar1 = *in_RDI;
  if (*(char *)(lVar1 + 0xf0) == '\0') {
    *(undefined1 *)(lVar1 + 0xf0) = 1;
    JS_ThrowInternalError(in_RSI,"out of memory");
    *(undefined1 *)(lVar1 + 0xf0) = 0;
  }
  return;
}

Assistant:

JSValue JS_ThrowOutOfMemory(JSContext *ctx)
{
    JSRuntime *rt = ctx->rt;
    if (!rt->in_out_of_memory) {
        rt->in_out_of_memory = TRUE;
        JS_ThrowInternalError(ctx, "out of memory");
        rt->in_out_of_memory = FALSE;
    }
    return JS_EXCEPTION;
}